

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleIncomplete(RunContext *this,AssertionInfo *info)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_100;
  AssertionResult local_a8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  local_100.message._M_dataplus._M_p = (pointer)&local_100.message.field_2;
  local_100.message._M_string_length = 0;
  local_100.message.field_2._M_local_buf[0] = '\0';
  local_100.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_100.reconstructedExpression.field_2;
  local_100.reconstructedExpression._M_string_length = 0;
  local_100.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_100.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_100.lazyExpression.m_isNegated = false;
  local_100.resultType = ThrewException;
  std::__cxx11::string::assign((char *)&local_100);
  local_a8.m_info.resultDisposition = info->resultDisposition;
  local_a8.m_info._52_4_ = *(undefined4 *)&info->field_0x34;
  local_a8.m_info.macroName.m_start = (info->macroName).m_start;
  local_a8.m_info.macroName.m_size = (info->macroName).m_size;
  local_a8.m_info.lineInfo.file = (info->lineInfo).file;
  local_a8.m_info.lineInfo.line = (info->lineInfo).line;
  local_a8.m_info.capturedExpression.m_start = (info->capturedExpression).m_start;
  local_a8.m_info.capturedExpression.m_size = (info->capturedExpression).m_size;
  AssertionResultData::AssertionResultData(&local_a8.m_resultData,&local_100);
  assertionEnded(this,&local_a8);
  AssertionResultData::~AssertionResultData(&local_a8.m_resultData);
  AssertionResultData::~AssertionResultData(&local_100);
  return;
}

Assistant:

void RunContext::handleIncomplete(
            AssertionInfo const& info
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = "Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE";
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
    }